

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O1

void duckdb::ArrowVarcharToStringViewData::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  idx_t iVar1;
  reference pvVar2;
  ArrowBuffer *pAVar3;
  
  result->n_buffers = 4;
  pvVar2 = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,1);
  result->buffers[1] = pvVar2->dataptr;
  pvVar2 = vector<duckdb::ArrowBuffer,_true>::operator[](&append_data->arrow_buffers,2);
  result->buffers[2] = pvVar2->dataptr;
  iVar1 = append_data->offset;
  pAVar3 = ArrowAppendData::GetBufferSizeBuffer(append_data);
  *(idx_t *)pAVar3->dataptr = iVar1;
  pAVar3 = ArrowAppendData::GetBufferSizeBuffer(append_data);
  result->buffers[3] = pAVar3->dataptr;
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		// We output four buffers
		result->n_buffers = 4;
		// Buffer 0 is the validity mask
		// Buffer 1 is our string views (short/long strings)
		result->buffers[1] = append_data.GetMainBuffer().data();
		// Buffer 2 is our only data buffer, could theoretically be more [ buffers ]
		result->buffers[2] = append_data.GetAuxBuffer().data();
		// Buffer 3 is the data-buffer lengths buffer, and we also populate it in to finalize
		reinterpret_cast<int64_t *>(append_data.GetBufferSizeBuffer().data())[0] =
		    UnsafeNumericCast<int64_t>(append_data.offset);
		result->buffers[3] = append_data.GetBufferSizeBuffer().data();
	}